

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool should_prune_intra_modes_using_neighbors
                (MACROBLOCKD *xd,_Bool enable_intra_mode_pruning_using_neighbors,
                PREDICTION_MODE this_mode,PREDICTION_MODE above_mode,PREDICTION_MODE left_mode)

{
  _Bool local_15;
  PREDICTION_MODE left_mode_local;
  PREDICTION_MODE above_mode_local;
  PREDICTION_MODE this_mode_local;
  _Bool enable_intra_mode_pruning_using_neighbors_local;
  MACROBLOCKD *xd_local;
  _Bool local_1;
  
  if (enable_intra_mode_pruning_using_neighbors) {
    if (this_mode == '\0') {
      local_1 = false;
    }
    else {
      local_15 = false;
      if ((((xd->up_available & 1U) != 0) && (local_15 = false, this_mode != above_mode)) &&
         (local_15 = false, (xd->left_available & 1U) != 0)) {
        local_15 = this_mode != left_mode;
      }
      local_1 = local_15;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool should_prune_intra_modes_using_neighbors(
    const MACROBLOCKD *xd, bool enable_intra_mode_pruning_using_neighbors,
    PREDICTION_MODE this_mode, PREDICTION_MODE above_mode,
    PREDICTION_MODE left_mode) {
  if (!enable_intra_mode_pruning_using_neighbors) return false;

  // Avoid pruning of DC_PRED as it is the most probable mode to win as per the
  // statistics generated for nonrd intra mode evaluations.
  if (this_mode == DC_PRED) return false;

  // Enable the pruning for current mode only if it is not the winner mode of
  // both the neighboring blocks (left/top).
  return xd->up_available && this_mode != above_mode && xd->left_available &&
         this_mode != left_mode;
}